

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O2

void __thiscall
ScriptUtil_CreatePegoutLogkingScriptTest_Test::TestBody
          (ScriptUtil_CreatePegoutLogkingScriptTest_Test *this)

{
  _func_int **lhs;
  bool bVar1;
  long lVar2;
  char *message;
  pointer pPVar3;
  initializer_list<PegoutTestVector> __l;
  allocator_type local_7cf;
  allocator local_7ce;
  allocator local_7cd;
  allocator local_7cc;
  allocator local_7cb;
  allocator local_7ca;
  allocator local_7c9;
  allocator local_7c8;
  allocator local_7c7;
  allocator local_7c6;
  allocator local_7c5;
  allocator local_7c4;
  allocator local_7c3;
  allocator local_7c2;
  allocator local_7c1;
  allocator local_7c0;
  allocator local_7bf;
  allocator local_7be;
  allocator local_7bd;
  allocator local_7bc;
  allocator local_7bb;
  allocator local_7ba;
  allocator local_7b9;
  AssertionResult gtest_ar;
  string local_798;
  vector<PegoutTestVector,_std::allocator<PegoutTestVector>_> test_vectors;
  Script local_760;
  Script actual;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  PegoutTestVector test_vector;
  BlockHash local_3f0;
  Script local_3d0;
  Pubkey local_398;
  ByteData local_380;
  Script local_368;
  BlockHash local_330;
  Script local_310;
  Pubkey local_2d8;
  ByteData local_2c0;
  Script local_2a8;
  BlockHash local_270;
  Script local_250;
  Pubkey local_218;
  ByteData local_200;
  Script local_1e8;
  BlockHash local_1b0;
  Script local_190;
  Pubkey local_158;
  ByteData local_140;
  Script local_128;
  BlockHash local_f0;
  Script local_d0;
  Pubkey local_98;
  ByteData local_80;
  Script local_68;
  
  cfd::core::BlockHash::BlockHash(&test_vector.genesisblock_hash);
  cfd::core::Script::Script(&test_vector.parent_locking_script);
  cfd::core::Pubkey::Pubkey(&test_vector.btc_pubkey_bytes);
  cfd::core::ByteData::ByteData(&test_vector.whitelist_proof);
  std::__cxx11::string::string((string *)&actual,"6a0000",&local_7b9);
  cfd::core::Script::Script(&test_vector.expect_script,(string *)&actual);
  std::__cxx11::string::string
            ((string *)&local_760,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"
             ,&local_7ba);
  cfd::core::BlockHash::BlockHash(&local_3f0,(string *)&local_760);
  std::__cxx11::string::string
            ((string *)&local_798,"a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487",&local_7bb);
  cfd::core::Script::Script(&local_3d0,&local_798);
  std::__cxx11::string::string
            ((string *)&gtest_ar,
             "03d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c",&local_7bc);
  cfd::core::Pubkey::Pubkey(&local_398,(string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)&local_4d0,
             "01044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"
             ,&local_7bd);
  cfd::core::ByteData::ByteData(&local_380,&local_4d0);
  std::__cxx11::string::string
            ((string *)&local_4f0,
             "6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4872103d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"
             ,&local_7be);
  cfd::core::Script::Script(&local_368,&local_4f0);
  std::__cxx11::string::string
            ((string *)&local_510,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"
             ,&local_7bf);
  cfd::core::BlockHash::BlockHash(&local_330,&local_510);
  std::__cxx11::string::string
            ((string *)&local_530,
             "002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437",&local_7c0);
  cfd::core::Script::Script(&local_310,&local_530);
  std::__cxx11::string::string
            ((string *)&local_550,
             "03d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c",&local_7c1);
  cfd::core::Pubkey::Pubkey(&local_2d8,&local_550);
  std::__cxx11::string::string
            ((string *)&local_570,
             "01044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"
             ,&local_7c2);
  cfd::core::ByteData::ByteData(&local_2c0,&local_570);
  std::__cxx11::string::string
            ((string *)&local_590,
             "6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a4372103d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"
             ,&local_7c3);
  cfd::core::Script::Script(&local_2a8,&local_590);
  std::__cxx11::string::string
            ((string *)&local_5b0,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"
             ,&local_7c4);
  cfd::core::BlockHash::BlockHash(&local_270,&local_5b0);
  std::__cxx11::string::string
            ((string *)&local_5d0,
             "002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437",&local_7c5);
  cfd::core::Script::Script(&local_250,&local_5d0);
  cfd::core::Pubkey::Pubkey(&local_218);
  std::__cxx11::string::string
            ((string *)&local_5f0,
             "01044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"
             ,&local_7c6);
  cfd::core::ByteData::ByteData(&local_200,&local_5f0);
  std::__cxx11::string::string
            ((string *)&local_610,
             "6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"
             ,&local_7c7);
  cfd::core::Script::Script(&local_1e8,&local_610);
  std::__cxx11::string::string
            ((string *)&local_630,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"
             ,&local_7c8);
  cfd::core::BlockHash::BlockHash(&local_1b0,&local_630);
  std::__cxx11::string::string
            ((string *)&local_650,
             "002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437",&local_7c9);
  cfd::core::Script::Script(&local_190,&local_650);
  std::__cxx11::string::string
            ((string *)&local_670,
             "03d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c",&local_7ca);
  cfd::core::Pubkey::Pubkey(&local_158,&local_670);
  cfd::core::ByteData::ByteData(&local_140);
  std::__cxx11::string::string
            ((string *)&local_690,
             "6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"
             ,&local_7cb);
  cfd::core::Script::Script(&local_128,&local_690);
  std::__cxx11::string::string
            ((string *)&local_6b0,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"
             ,&local_7cc);
  cfd::core::BlockHash::BlockHash(&local_f0,&local_6b0);
  std::__cxx11::string::string
            ((string *)&local_6d0,
             "002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437",&local_7cd);
  cfd::core::Script::Script(&local_d0,&local_6d0);
  cfd::core::Pubkey::Pubkey(&local_98);
  cfd::core::ByteData::ByteData(&local_80);
  std::__cxx11::string::string
            ((string *)&local_6f0,
             "6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"
             ,&local_7ce);
  cfd::core::Script::Script(&local_68,&local_6f0);
  __l._M_len = 6;
  __l._M_array = &test_vector;
  std::vector<PegoutTestVector,_std::allocator<PegoutTestVector>_>::vector
            (&test_vectors,__l,&local_7cf);
  lVar2 = 0x3c0;
  do {
    PegoutTestVector::~PegoutTestVector
              ((PegoutTestVector *)((long)&test_vector.genesisblock_hash._vptr_BlockHash + lVar2));
    lVar2 = lVar2 + -0xc0;
  } while (lVar2 != -0xc0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_798);
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::~string((string *)&actual);
  cfd::core::Script::Script(&actual);
  for (pPVar3 = test_vectors.super__Vector_base<PegoutTestVector,_std::allocator<PegoutTestVector>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar3 != test_vectors.super__Vector_base<PegoutTestVector,_std::allocator<PegoutTestVector>_>
                ._M_impl.super__Vector_impl_data._M_finish; pPVar3 = pPVar3 + 1) {
    PegoutTestVector::PegoutTestVector(&test_vector,pPVar3);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::ScriptUtil::CreatePegoutLogkingScript
                  (&local_760,&test_vector.genesisblock_hash,&test_vector.parent_locking_script,
                   &test_vector.btc_pubkey_bytes,&test_vector.whitelist_proof);
        cfd::core::Script::operator=(&actual,&local_760);
        cfd::core::Script::~Script(&local_760);
      }
    }
    else {
      testing::Message::Message((Message *)&local_760);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_798,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x1e3,
                 "Expected: (actual = ScriptUtil::CreatePegoutLogkingScript(test_vector.genesisblock_hash, test_vector.parent_locking_script, test_vector.btc_pubkey_bytes, test_vector.whitelist_proof)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)&local_760);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_760);
    }
    cfd::core::Script::GetHex_abi_cxx11_((string *)&local_760,&actual);
    lhs = local_760._vptr_Script;
    cfd::core::Script::GetHex_abi_cxx11_(&local_798,&test_vector.expect_script);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"actual.GetHex().c_str()",
               "test_vector.expect_script.GetHex().c_str()",(char *)lhs,local_798._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_798);
    std::__cxx11::string::~string((string *)&local_760);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_760);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_798,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x1e4,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)&local_760);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_760);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    PegoutTestVector::~PegoutTestVector(&test_vector);
  }
  cfd::core::Script::~Script(&actual);
  std::vector<PegoutTestVector,_std::allocator<PegoutTestVector>_>::~vector(&test_vectors);
  return;
}

Assistant:

TEST(ScriptUtil, CreatePegoutLogkingScriptTest) {
  std::vector<PegoutTestVector> test_vectors = {
    {
      BlockHash(),
      Script(),
      Pubkey(),
      ByteData(),
      Script("6a0000"),
    },
    {
      BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
      Script("a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487"),
      Pubkey("03d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c"),
      ByteData("01044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"),
      Script("6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4872103d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"),
    },
    {
      BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
      Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
      Pubkey("03d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c"),
      ByteData("01044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"),
      Script("6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a4372103d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"),
    },
    // invalid Pubkey
    {
      BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
      Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
      Pubkey(),
      ByteData("01044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"),
      Script("6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
    },
    // empty whitelist proof
    {
      BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
      Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
      Pubkey("03d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c"),
      ByteData(),
      Script("6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
    },
    // invalid Pubkey and empty whitelist proof
    {
      BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
      Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
      Pubkey(),
      ByteData(),
      Script("6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
    },
  };

  Script actual;
  for (PegoutTestVector test_vector : test_vectors) {
    EXPECT_NO_THROW((actual = ScriptUtil::CreatePegoutLogkingScript(test_vector.genesisblock_hash, test_vector.parent_locking_script, test_vector.btc_pubkey_bytes, test_vector.whitelist_proof)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_script.GetHex().c_str());
  }
}